

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::web_seed_t::web_seed_t
          (web_seed_t *this,string *url_,string *auth_,headers_t *extra_headers_)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  pointer pcVar3;
  time_point32 tVar4;
  string local_a0;
  string local_80;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  data_union local_44;
  
  pcVar3 = (url_->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar3,pcVar3 + url_->_M_string_length);
  pcVar3 = (auth_->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar3,pcVar3 + auth_->_M_string_length);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_60,extra_headers_);
  web_seed_entry::web_seed_entry(&this->super_web_seed_entry,&local_80,&local_a0,&local_60);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  tVar4 = time_now32();
  *(duration *)&(this->super_web_seed_entry).field_0x5c = tVar4.__d.__r;
  (this->endpoints).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_44.base.sa_data[6] = '\0';
  local_44.base.sa_data[7] = '\0';
  local_44.base.sa_data[8] = '\0';
  local_44.base.sa_data[9] = '\0';
  local_44.base.sa_data[10] = '\0';
  local_44.base.sa_data[0xb] = '\0';
  local_44.base.sa_data[0xc] = '\0';
  local_44.base.sa_data[0xd] = '\0';
  local_44._16_8_ = 0;
  local_44.v6.sin6_scope_id = 0;
  local_44._0_8_ = 2;
  ipv4_peer::ipv4_peer(&this->peer_info,(endpoint *)&local_44.base,true,(peer_source_flags_t)0x0);
  this->supports_keepalive = true;
  this->resolving = false;
  this->removed = false;
  this->interesting = true;
  this->ephemeral = false;
  this->no_local_ips = false;
  this->disabled = false;
  (this->restart_request).piece = -1;
  (this->restart_request).start = -1;
  (this->restart_request).length = -1;
  (this->restart_piece).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->restart_piece).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->restart_piece).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  p_Var1 = &(this->redirects)._M_t._M_impl.super__Rb_tree_header;
  (this->redirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->redirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->redirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->redirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->redirects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->have_files).super_bitfield.m_buf.
  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> =
       (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
  puVar2 = &(this->peer_info).super_torrent_peer.field_0x1e;
  *puVar2 = *puVar2 | 0x80;
  return;
}

Assistant:

web_seed_t::web_seed_t(std::string const& url_
		, std::string const& auth_
		, web_seed_entry::headers_t const& extra_headers_)
		: web_seed_entry(url_, auth_, extra_headers_)
	{
		peer_info.web_seed = true;
	}